

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreSkipTables.h
# Opt level: O3

bool __thiscall
axl::sl::BoyerMooreGoodSkipTableBase<char>::build
          (BoyerMooreGoodSkipTableBase<char> *this,char *pattern,size_t patternLength)

{
  size_t sVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  unsigned_long *puVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  ulong uVar12;
  
  bVar3 = Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::
          setCountImpl<axl::sl::SimpleArrayDetails<unsigned_long>::Construct>
                    ((Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)this,
                     patternLength);
  if (bVar3) {
    bVar4 = Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::ensureExclusive
                      ((Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)this);
    if (bVar4) {
      puVar5 = (this->super_BoyerMooreSkipTableRoot).m_table.
               super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_p;
    }
    else {
      puVar5 = (unsigned_long *)0x0;
    }
    sVar6 = patternLength - 1;
    if (-1 < (long)sVar6) {
      uVar7 = 0;
      sVar8 = patternLength;
      sVar10 = sVar6;
      sVar9 = sVar6;
      do {
        sVar1 = sVar9 + 1;
        if (patternLength == sVar1) {
LAB_00121c46:
          sVar10 = sVar1;
        }
        else if (*pattern == pattern[sVar1]) {
          uVar2 = 1;
          do {
            uVar12 = uVar2;
            if (uVar7 == uVar12) break;
            uVar2 = uVar12 + 1;
          } while (pattern[uVar12] == pattern[uVar12 + sVar8]);
          if (patternLength - sVar1 <= uVar12) goto LAB_00121c46;
        }
        puVar5[sVar9] = ~sVar9 + patternLength + sVar10;
        uVar7 = uVar7 + 1;
        sVar8 = sVar8 - 1;
        bVar4 = 0 < (long)sVar9;
        sVar9 = sVar9 - 1;
      } while (bVar4);
      if (sVar6 == 0) {
        return bVar3;
      }
    }
    sVar8 = 0;
    do {
      if (sVar8 == 0) {
        sVar10 = 0;
      }
      else {
        sVar9 = 0;
        pcVar11 = pattern;
        do {
          sVar10 = sVar9;
          if (pcVar11[sVar8] != pcVar11[sVar6]) break;
          sVar9 = sVar9 + 1;
          pcVar11 = pcVar11 + -1;
          sVar10 = sVar8;
        } while (sVar8 != sVar9);
      }
      if (pattern[sVar8 - sVar10] != pattern[sVar6 - sVar10]) {
        puVar5[sVar6 - sVar10] = (sVar6 - sVar8) + sVar10;
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != sVar6);
  }
  return bVar3;
}

Assistant:

bool
	build(
		const C* pattern,
		size_t patternLength
	) {
		bool result = m_table.setCount(patternLength);
		if (!result)
			return false;

		sl::Array<size_t>::Rwi rwi = m_table;
		intptr_t lastPrefixPos = patternLength - 1;
		for (intptr_t i = patternLength - 1; i >= 0; i--) {
			if (isPrefix(pattern, patternLength, i + 1))
				lastPrefixPos = i + 1;

			rwi[i] = lastPrefixPos + patternLength - 1 - i;
		}

		for (intptr_t i = 0; i < patternLength - 1; i++) {
			size_t suffixLength = calcSuffixLength(pattern, patternLength, i);
			if (pattern[i - suffixLength] != pattern[patternLength - 1 - suffixLength])
				rwi[patternLength - 1 - suffixLength] = patternLength - 1 - i + suffixLength;
		}

		return true;
	}